

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O3

void __thiscall PrintC::emitBlockInfLoop(PrintC *this,BlockInfLoop *bl)

{
  iterator __position;
  EmitXml *pEVar1;
  FlowBlock *pFVar2;
  pointer puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  
  __position._M_current =
       (this->super_PrintLanguage).modstack.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_PrintLanguage).modstack.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &(this->super_PrintLanguage).modstack,__position,&(this->super_PrintLanguage).mods);
    uVar4 = (this->super_PrintLanguage).mods;
  }
  else {
    uVar4 = (this->super_PrintLanguage).mods;
    *__position._M_current = uVar4;
    (this->super_PrintLanguage).modstack.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  (this->super_PrintLanguage).mods = uVar4 & 0xfffffe7f;
  emitAnyLabelStatement(this,(FlowBlock *)bl);
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"do",0);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
  uVar4 = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0x22])();
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"{",8);
  pEVar1 = (this->super_PrintLanguage).emit;
  uVar5 = (*pEVar1->_vptr_EmitXml[6])
                    (pEVar1,*(bl->super_BlockGraph).list.
                             super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
                             super__Vector_impl_data._M_start);
  pFVar2 = *(bl->super_BlockGraph).list.
            super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  (*pFVar2->_vptr_FlowBlock[0xc])(pFVar2,this);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[7])(pEVar1,(ulong)uVar5);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x23])(pEVar1,(ulong)uVar4);
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"}",8);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
  iVar6 = (*(*(bl->super_BlockGraph).list.
              super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
              super__Vector_impl_data._M_start)->_vptr_FlowBlock[0xe])();
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x13])(pEVar1,"while",0,CONCAT44(extraout_var,iVar6));
  pEVar1 = (this->super_PrintLanguage).emit;
  uVar4 = (*pEVar1->_vptr_EmitXml[0x1a])(pEVar1,0x28,0);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"true",5);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x1b])(pEVar1,0x29,(ulong)uVar4);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,";",8);
  puVar3 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_PrintLanguage).mods = puVar3[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar3 + -1;
  return;
}

Assistant:

void PrintC::emitBlockInfLoop(const BlockInfLoop *bl)

{
  const PcodeOp *op;

  pushMod();
  unsetMod(no_branch|only_branch);
  emitAnyLabelStatement(bl);
  emit->tagLine();
  emit->print("do",EmitXml::keyword_color);
  emit->spaces(1);
  int4 id = emit->startIndent();
  emit->print("{");
  int4 id1 = emit->beginBlock(bl->getBlock(0));
  bl->getBlock(0)->emit(this);
  emit->endBlock(id1);
  emit->stopIndent(id);
  emit->tagLine();
  emit->print("}");
  emit->spaces(1);
  op = bl->getBlock(0)->lastOp();
  emit->tagOp("while",EmitXml::keyword_color,op);
  int4 id2 = emit->openParen('(');
  emit->spaces(1);
  emit->print("true",EmitXml::const_color);
  emit->spaces(1);
  emit->closeParen(')',id2);
  emit->print(";");
  popMod();
}